

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::Options::checked_parse_arg
          (Options *this,int argc,char **argv,int *current,shared_ptr<cxxopts::OptionDetails> *value
          ,string *name)

{
  char *pcVar1;
  string *psVar2;
  uint uVar3;
  element_type *peVar4;
  Value *pVVar5;
  missing_argument_exception *this_00;
  allocator local_e9;
  string local_e8;
  shared_ptr<cxxopts::OptionDetails> local_c8;
  allocator local_b1;
  string local_b0;
  shared_ptr<cxxopts::OptionDetails> local_90 [2];
  allocator local_69;
  string local_68;
  shared_ptr<cxxopts::OptionDetails> local_48;
  string *local_38;
  string *name_local;
  shared_ptr<cxxopts::OptionDetails> *value_local;
  int *current_local;
  char **argv_local;
  Options *pOStack_10;
  int argc_local;
  Options *this_local;
  
  local_38 = name;
  name_local = (string *)value;
  value_local = (shared_ptr<cxxopts::OptionDetails> *)current;
  current_local = (int *)argv;
  argv_local._4_4_ = argc;
  pOStack_10 = this;
  if (*current + 1 < argc) {
    if (*argv[*current + 1] == '-') {
      peVar4 = std::
               __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)value);
      pVVar5 = OptionDetails::value(peVar4);
      uVar3 = (*pVVar5->_vptr_Value[4])();
      if ((uVar3 & 1) != 0) {
        std::shared_ptr<cxxopts::OptionDetails>::shared_ptr(local_90,value);
        psVar2 = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
        parse_option(this,local_90,psVar2,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr(local_90);
        return;
      }
    }
    std::shared_ptr<cxxopts::OptionDetails>::shared_ptr(&local_c8,value);
    psVar2 = local_38;
    pcVar1 = *(char **)(current_local +
                       (long)*(int *)&(value_local->
                                      super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr * 2 + 2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,pcVar1,&local_e9);
    parse_option(this,&local_c8,psVar2,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr(&local_c8);
    *(int *)&(value_local->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr =
         *(int *)&(value_local->
                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1
    ;
  }
  else {
    peVar4 = std::
             __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)value);
    pVVar5 = OptionDetails::value(peVar4);
    uVar3 = (*pVVar5->_vptr_Value[4])();
    if ((uVar3 & 1) == 0) {
      this_00 = (missing_argument_exception *)__cxa_allocate_exception(0x28);
      missing_argument_exception::missing_argument_exception(this_00,local_38);
      __cxa_throw(this_00,&missing_argument_exception::typeinfo,
                  missing_argument_exception::~missing_argument_exception);
    }
    std::shared_ptr<cxxopts::OptionDetails>::shared_ptr(&local_48,value);
    psVar2 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"",&local_69);
    parse_option(this,&local_48,psVar2,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr(&local_48);
  }
  return;
}

Assistant:

void
Options::checked_parse_arg
(
  int argc,
  char* argv[],
  int& current,
  std::shared_ptr<OptionDetails> value,
  const std::string& name
)
{
  if (current + 1 >= argc)
  {
    if (value->value().has_implicit())
    {
      parse_option(value, name, "");
    }
    else
    {
      throw missing_argument_exception(name);
    }
  }
  else
  {
    if (argv[current + 1][0] == '-' && value->value().has_implicit())
    {
      parse_option(value, name, "");
    }
    else
    {
      parse_option(value, name, argv[current + 1]);
      ++current;
    }
  }
}